

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_pool.c
# Opt level: O1

upb_FileDef *
upb_DefBuilder_AddFileToPool
          (upb_DefBuilder *builder,upb_DefPool *s,google_protobuf_FileDescriptorProto *file_proto,
          upb_StringView name,upb_Status *status)

{
  upb_FileDef *puVar1;
  upb_Arena *a;
  _Bool _Var2;
  int iVar3;
  upb_deftype_t uVar4;
  upb_FieldDef *f;
  upb_ServiceDef *s_00;
  upb_FileDef *puVar5;
  upb_EnumValueDef *v;
  upb_EnumDef *e;
  upb_MessageDef *m;
  google_protobuf_FeatureSet *__s;
  char *pcVar6;
  upb_strtable *t;
  intptr_t iter;
  upb_StringView key;
  upb_value local_60;
  char *local_58;
  google_protobuf_FileDescriptorProto *local_50;
  intptr_t local_48;
  upb_StringView local_40;
  
  pcVar6 = name.data;
  iVar3 = _setjmp((__jmp_buf_tag *)builder->err);
  if (iVar3 != 0) {
    _Var2 = upb_Status_IsOk(status);
    if (_Var2) {
      __assert_fail("!upb_Status_IsOk(status)",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/reflection/def_pool.c"
                    ,0x15e,
                    "const upb_FileDef *upb_DefBuilder_AddFileToPool(upb_DefBuilder *const, upb_DefPool *const, const google_protobuf_FileDescriptorProto *const, const upb_StringView, upb_Status *const)"
                   );
    }
    puVar1 = builder->file;
    if (puVar1 != (upb_FileDef *)0x0) {
      local_48 = -1;
      t = &s->syms;
      _Var2 = upb_strtable_next2(t,&local_40,&local_60,&local_48);
      if (_Var2) {
        do {
          uVar4 = _upb_DefType_Type(local_60);
          switch(uVar4) {
          case UPB_DEFTYPE_EXT:
            f = (upb_FieldDef *)_upb_DefType_Unpack(local_60,UPB_DEFTYPE_EXT);
            puVar5 = upb_FieldDef_File(f);
            break;
          case UPB_DEFTYPE_MSG:
            m = (upb_MessageDef *)_upb_DefType_Unpack(local_60,UPB_DEFTYPE_MSG);
            puVar5 = upb_MessageDef_File(m);
            break;
          case UPB_DEFTYPE_ENUM:
            e = (upb_EnumDef *)_upb_DefType_Unpack(local_60,UPB_DEFTYPE_ENUM);
            goto LAB_0011234b;
          case UPB_DEFTYPE_ENUMVAL:
            v = (upb_EnumValueDef *)_upb_DefType_Unpack(local_60,UPB_DEFTYPE_ENUMVAL);
            e = upb_EnumValueDef_Enum(v);
LAB_0011234b:
            puVar5 = upb_EnumDef_File(e);
            break;
          case UPB_DEFTYPE_SERVICE:
            s_00 = (upb_ServiceDef *)_upb_DefType_Unpack(local_60,UPB_DEFTYPE_SERVICE);
            puVar5 = upb_ServiceDef_File(s_00);
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/reflection/def_pool.c"
                          ,0x152,"void remove_filedef(upb_DefPool *, upb_FileDef *)");
          }
          if (puVar5 == puVar1) {
            upb_strtable_removeiter(t,&local_48);
          }
          _Var2 = upb_strtable_next2(t,&local_40,&local_60,&local_48);
        } while (_Var2);
      }
      builder->file = (upb_FileDef *)0x0;
    }
LAB_0011248f:
    if (builder->arena != (upb_Arena *)0x0) {
      upb_Arena_Free(builder->arena);
    }
    if (builder->tmp_arena != (upb_Arena *)0x0) {
      upb_Arena_Free(builder->tmp_arena);
    }
    return builder->file;
  }
  if (((builder->arena != (upb_Arena *)0x0) && (builder->tmp_arena != (upb_Arena *)0x0)) &&
     (_Var2 = upb_strtable_init(&builder->feature_cache,0x10,builder->tmp_arena), _Var2)) {
    a = builder->tmp_arena;
    __s = (google_protobuf_FeatureSet *)a->ptr_dont_copy_me__upb_internal_use_only;
    local_58 = pcVar6;
    local_50 = file_proto;
    if ((ulong)((long)a->end_dont_copy_me__upb_internal_use_only - (long)__s) < 0x28) {
      __s = (google_protobuf_FeatureSet *)
            _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,0x28);
    }
    else {
      if ((google_protobuf_FeatureSet *)
          ((ulong)((long)&(__s->base_dont_copy_me__upb_internal_use_only).field_0 + 7U) &
          0xfffffffffffffff8) != __s) {
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mem/internal/arena.h"
                      ,0x3f,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      a->ptr_dont_copy_me__upb_internal_use_only = (char *)(__s + 5);
    }
    if (__s == (google_protobuf_FeatureSet *)0x0) {
      __s = (google_protobuf_FeatureSet *)0x0;
    }
    else {
      memset(__s,0,0x28);
    }
    pcVar6 = local_58;
    builder->legacy_features = __s;
    if (__s != (google_protobuf_FeatureSet *)0x0) {
      _upb_FileDef_Create(builder,local_50);
      upb_strtable_insert(&s->files,pcVar6,name.size,(upb_value)builder->file,builder->arena);
      _Var2 = upb_Status_IsOk(status);
      if (!_Var2) {
        __assert_fail("upb_Status_IsOk(status)",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/reflection/def_pool.c"
                      ,0x16d,
                      "const upb_FileDef *upb_DefBuilder_AddFileToPool(upb_DefBuilder *const, upb_DefPool *const, const google_protobuf_FileDescriptorProto *const, const upb_StringView, upb_Status *const)"
                     );
      }
      upb_Arena_Fuse(s->arena,builder->arena);
      goto LAB_0011248f;
    }
  }
  _upb_DefBuilder_OomErr(builder);
}

Assistant:

static const upb_FileDef* upb_DefBuilder_AddFileToPool(
    upb_DefBuilder* const builder, upb_DefPool* const s,
    const UPB_DESC(FileDescriptorProto) * const file_proto,
    const upb_StringView name, upb_Status* const status) {
  if (UPB_SETJMP(builder->err) != 0) {
    UPB_ASSERT(!upb_Status_IsOk(status));
    if (builder->file) {
      remove_filedef(s, builder->file);
      builder->file = NULL;
    }
  } else if (!builder->arena || !builder->tmp_arena ||
             !upb_strtable_init(&builder->feature_cache, 16,
                                builder->tmp_arena) ||
             !(builder->legacy_features =
                   UPB_DESC(FeatureSet_new)(builder->tmp_arena))) {
    _upb_DefBuilder_OomErr(builder);
  } else {
    _upb_FileDef_Create(builder, file_proto);
    upb_strtable_insert(&s->files, name.data, name.size,
                        upb_value_constptr(builder->file), builder->arena);
    UPB_ASSERT(upb_Status_IsOk(status));
    upb_Arena_Fuse(s->arena, builder->arena);
  }

  if (builder->arena) upb_Arena_Free(builder->arena);
  if (builder->tmp_arena) upb_Arena_Free(builder->tmp_arena);
  return builder->file;
}